

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

void __thiscall
QMakeSourceFileInfo::addSourceFiles
          (QMakeSourceFileInfo *this,ProStringList *l,uchar seek,SourceFileType type)

{
  long lVar1;
  QList<ProString> *this_00;
  qsizetype qVar2;
  undefined4 in_ECX;
  undefined1 in_DL;
  QMakeSourceFileInfo *in_RSI;
  long in_FS_OFFSET;
  int i;
  ProString *in_stack_ffffffffffffffa8;
  SourceFileType in_stack_ffffffffffffffc0;
  int iVar3;
  undefined3 in_stack_ffffffffffffffcc;
  undefined4 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = CONCAT13(in_DL,in_stack_ffffffffffffffcc);
  iVar3 = 0;
  while( true ) {
    this_00 = (QList<ProString> *)(long)iVar3;
    qVar2 = QList<ProString>::size((QList<ProString> *)in_RSI);
    if (qVar2 <= (long)this_00) break;
    QList<ProString>::at(this_00,(qsizetype)in_stack_ffffffffffffffa8);
    ProString::toQString(in_stack_ffffffffffffffa8);
    addSourceFile(in_RSI,(QString *)CONCAT44(uVar4,in_ECX),(uchar)((uint)iVar3 >> 0x18),
                  in_stack_ffffffffffffffc0);
    QString::~QString((QString *)0x1d04ad);
    iVar3 = iVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeSourceFileInfo::addSourceFiles(const ProStringList &l, uchar seek,
                                         QMakeSourceFileInfo::SourceFileType type)
{
    for(int i=0; i<l.size(); ++i)
        addSourceFile(l.at(i).toQString(), seek, type);
}